

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O2

void __thiscall OpenMD::NVT::moveA(NVT *this)

{
  double dVar1;
  RotationAlgorithm *pRVar2;
  Molecule *pMVar3;
  pointer ppSVar4;
  StuntDouble *this_00;
  double dVar5;
  pair<double,_double> thermostat;
  MoleculeIterator i;
  Vector3d pos;
  Vector3d frc;
  Vector3d vel;
  Vector3d ji;
  Vector3d Tb;
  pair<double,_double> local_120;
  RealType local_110;
  Molecule *local_108;
  pointer local_100;
  MoleculeIterator local_f8;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  local_f8._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&local_48);
  Vector<double,_3U>::Vector(&local_60);
  Vector<double,_3U>::Vector(&local_78);
  Vector<double,_3U>::Vector(&local_f0);
  Vector<double,_3U>::Vector(&local_90);
  local_120 = Snapshot::getThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap);
  local_110 = Thermo::getTemperature
                        (&(this->super_VelocityVerletIntegrator).super_Integrator.thermo);
  pMVar3 = SimInfo::beginMolecule
                     ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_f8);
  while (pMVar3 != (Molecule *)0x0) {
    ppSVar4 = (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_108 = pMVar3;
    if (ppSVar4 !=
        (pMVar3->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0017df50;
    this_00 = (StuntDouble *)0x0;
    while (this_00 != (StuntDouble *)0x0) {
      local_100 = ppSVar4;
      StuntDouble::getVel((Vector3d *)&local_a8,this_00);
      Vector<double,_3U>::operator=(&local_78,&local_a8);
      StuntDouble::getPos((Vector3d *)&local_a8,this_00);
      Vector<double,_3U>::operator=(&local_f0,&local_a8);
      StuntDouble::getFrc((Vector3d *)&local_a8,this_00);
      Vector<double,_3U>::operator=(&local_90,&local_a8);
      operator*(&local_c0,
                ((this->super_VelocityVerletIntegrator).super_Integrator.dt2 * 0.0004184) /
                this_00->mass_,&local_90);
      operator*(&local_d8,
                (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * local_120.first,
                &local_78);
      operator-(&local_a8,&local_c0,&local_d8);
      Vector<double,_3U>::add(&local_78,&local_a8);
      operator*(&local_a8,(this->super_VelocityVerletIntegrator).super_Integrator.dt,&local_78);
      Vector<double,_3U>::add(&local_f0,&local_a8);
      StuntDouble::setVel(this_00,(Vector3d *)&local_78);
      StuntDouble::setPos(this_00,(Vector3d *)&local_f0);
      if (this_00->objType_ - otDAtom < 2) {
        StuntDouble::getTrq((Vector3d *)&local_c0,this_00);
        StuntDouble::lab2Body((Vector3d *)&local_a8,this_00,(Vector3d *)&local_c0);
        Vector<double,_3U>::operator=(&local_48,&local_a8);
        StuntDouble::getJ((Vector3d *)&local_a8,this_00);
        Vector<double,_3U>::operator=(&local_60,&local_a8);
        operator*(&local_c0,(this->super_VelocityVerletIntegrator).super_Integrator.dt2 * 0.0004184,
                  &local_48);
        operator*(&local_d8,
                  (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * local_120.first,
                  &local_60);
        operator-(&local_a8,&local_c0,&local_d8);
        Vector<double,_3U>::add(&local_60,&local_a8);
        pRVar2 = (this->super_VelocityVerletIntegrator).super_Integrator.rotAlgo_;
        (*pRVar2->_vptr_RotationAlgorithm[2])
                  ((this->super_VelocityVerletIntegrator).super_Integrator.dt,pRVar2,this_00,
                   &local_60);
        StuntDouble::setJ(this_00,(Vector3d *)&local_60);
      }
      ppSVar4 = local_100 + 1;
      this_00 = (StuntDouble *)0x0;
      if (ppSVar4 !=
          (local_108->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0017df50:
        this_00 = *ppSVar4;
      }
    }
    pMVar3 = SimInfo::nextMolecule
                       ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_f8);
  }
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[4])();
  Rattle::constraintA((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
  dVar1 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
  dVar5 = ((local_110 / this->targetTemp_ + -1.0) * dVar1) /
          (this->tauThermostat_ * this->tauThermostat_) + local_120.first;
  local_120.second = dVar5 * dVar1 + local_120.second;
  local_120.first = dVar5;
  Snapshot::setThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap,&local_120);
  return;
}

Assistant:

void NVT::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d Tb;
    Vector3d ji;
    RealType mass;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;

    pair<RealType, RealType> thermostat = snap->getThermostat();

    // We need the temperature at time = t for the chi update below:

    RealType instTemp = thermo.getTemperature();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel = sd->getVel();
        pos = sd->getPos();
        frc = sd->getFrc();

        mass = sd->getMass();

        // velocity half step (use chi from previous step here):
        vel += dt2 * Constants::energyConvert / mass * frc -
               dt2 * thermostat.first * vel;

        // position whole step
        pos += dt * vel;

        sd->setVel(vel);
        sd->setPos(pos);

        if (sd->isDirectional()) {
          // convert the torque to body frame
          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji +=
              dt2 * Constants::energyConvert * Tb - dt2 * thermostat.first * ji;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }

    flucQ_->moveA();
    rattle_->constraintA();

    // Finally, evolve chi a half step (just like a velocity) using
    // temperature at time t, not time t+dt/2

    thermostat.first += dt2 * (instTemp / targetTemp_ - 1.0) /
                        (tauThermostat_ * tauThermostat_);
    thermostat.second += thermostat.first * dt2;

    snap->setThermostat(thermostat);
  }